

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O3

int testInvalid_NoTrainingInputs(void)

{
  Rep *pRVar1;
  bool bVar2;
  TypeUnion TVar3;
  ModelDescription *pMVar4;
  ostream *poVar5;
  Type *pTVar6;
  FeatureType *this;
  ArrayFeatureType *this_00;
  long lVar7;
  int iVar8;
  long lVar9;
  void **ppvVar10;
  Model spec;
  FeatureDescription feature;
  Result res;
  TensorAttributes tensorAttributesOut;
  TensorAttributes tensorAttributesIn;
  Model local_170;
  undefined1 local_140 [8];
  _Alloc_hider local_138;
  undefined1 local_130 [32];
  pointer local_110;
  _Alloc_hider local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_e8;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_b8;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_88;
  TensorAttributes local_58;
  TensorAttributes local_48;
  
  CoreML::Specification::Model::Model(&local_170);
  CoreML::Result::Result((Result *)&local_110);
  local_48.name = "InTensor";
  local_48.dimension = 3;
  local_48._12_4_ = 0;
  local_58.name = "OutTensor";
  local_58.dimension = 1;
  local_58._12_4_ = 0;
  buildBasicNeuralNetworkModel(&local_170,true,&local_48,&local_58,0x400,false,false);
  local_170.specificationversion_ = 4;
  if (local_170._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_170);
    local_170._oneof_case_[0] = 500;
    TVar3.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(TVar3.neuralnetwork_);
    local_170.Type_.pipelineclassifier_ = TVar3.pipelineclassifier_;
  }
  TVar3 = local_170.Type_;
  addSoftmaxLayer(&local_170,"softmax","OutTensor","softmax_out");
  addCategoricalCrossEntropyLoss<CoreML::Specification::NeuralNetwork>
            (&local_170,TVar3.neuralnetwork_,"cross_entropy_loss_layer","softmax_out","target");
  addLearningRate<CoreML::Specification::NeuralNetwork>
            (TVar3.neuralnetwork_,kSgdOptimizer,0.699999988079071,0.0,1.0);
  local_88._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_88._M_impl.super__Rb_tree_header._M_header;
  local_88._M_impl._0_8_ = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_right =
       local_88._M_impl.super__Rb_tree_header._M_header._M_left;
  addMiniBatchSize<CoreML::Specification::NeuralNetwork>
            (TVar3.neuralnetwork_,kSgdOptimizer,10,5,100,
             (set<long,_std::less<long>,_std::allocator<long>_> *)&local_88);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&local_88);
  local_b8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_b8._M_impl.super__Rb_tree_header._M_header;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_b8._M_impl._0_8_ = 0;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_b8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_b8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_b8._M_impl.super__Rb_tree_header._M_header._M_left;
  addEpochs<CoreML::Specification::NeuralNetwork>
            (TVar3.neuralnetwork_,100,1,100,
             (set<long,_std::less<long>,_std::allocator<long>_> *)&local_b8);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&local_b8);
  local_e8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_e8._M_impl.super__Rb_tree_header._M_header;
  local_e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_e8._M_impl._0_8_ = 0;
  local_e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_e8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_e8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_e8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_e8._M_impl.super__Rb_tree_header._M_header._M_left;
  addShuffleAndSeed<CoreML::Specification::NeuralNetwork>
            (TVar3.neuralnetwork_,0x7e3,0,0x7e3,
             (set<long,_std::less<long>,_std::allocator<long>_> *)&local_e8);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&local_e8);
  if (local_170.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    local_170.description_ = pMVar4;
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
            (&((local_170.description_)->traininginput_).super_RepeatedPtrFieldBase);
  CoreML::Model::validate((Result *)local_140,&local_170);
  local_110 = (pointer)local_140;
  std::__cxx11::string::operator=((string *)&local_108,(string *)&local_138);
  if (local_138._M_p != local_130 + 8) {
    operator_delete(local_138._M_p,local_130._8_8_ + 1);
  }
  bVar2 = CoreML::Result::good((Result *)&local_110);
  if (bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
               ,0x7c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x56f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    iVar8 = 1;
    std::ostream::flush();
  }
  else {
    if (local_170.description_ == (ModelDescription *)0x0) {
      pMVar4 = (ModelDescription *)operator_new(0x78);
      CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
      local_170.description_ = pMVar4;
    }
    pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
             Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                       (&((local_170.description_)->traininginput_).super_RepeatedPtrFieldBase,
                        (Type *)0x0);
    local_140 = (undefined1  [8])local_130;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"target","");
    google::protobuf::internal::ArenaStringPtr::SetNoArena
              (&pTVar6->name_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
               (string *)local_140);
    if (local_140 != (undefined1  [8])local_130) {
      operator_delete((void *)local_140,local_130._0_8_ + 1);
    }
    this = pTVar6->type_;
    if (this == (FeatureType *)0x0) {
      this = (FeatureType *)operator_new(0x28);
      CoreML::Specification::FeatureType::FeatureType(this);
      pTVar6->type_ = this;
    }
    if (this->_oneof_case_[0] == 5) {
      this_00 = (this->Type_).multiarraytype_;
    }
    else {
      CoreML::Specification::FeatureType::clear_Type(this);
      this->_oneof_case_[0] = 5;
      this_00 = (ArrayFeatureType *)operator_new(0x48);
      CoreML::Specification::ArrayFeatureType::ArrayFeatureType(this_00);
      (this->Type_).multiarraytype_ = this_00;
    }
    this_00->datatype_ = 0x20020;
    iVar8 = (this_00->shape_).current_size_;
    if (iVar8 == (this_00->shape_).total_size_) {
      google::protobuf::RepeatedField<long>::Reserve(&this_00->shape_,iVar8 + 1);
      iVar8 = (this_00->shape_).current_size_;
    }
    (this_00->shape_).current_size_ = iVar8 + 1;
    ((this_00->shape_).rep_)->elements[iVar8] = 1;
    pMVar4 = local_170.description_;
    if (local_170.description_ == (ModelDescription *)0x0) {
      pMVar4 = (ModelDescription *)&CoreML::Specification::_ModelDescription_default_instance_;
    }
    pRVar1 = (pMVar4->input_).super_RepeatedPtrFieldBase.rep_;
    ppvVar10 = pRVar1->elements;
    if (pRVar1 == (Rep *)0x0) {
      ppvVar10 = (void **)0x0;
    }
    lVar7 = (long)(pMVar4->input_).super_RepeatedPtrFieldBase.current_size_;
    if (lVar7 != 0) {
      lVar9 = 0;
      do {
        CoreML::Specification::FeatureDescription::FeatureDescription
                  ((FeatureDescription *)local_140,*(FeatureDescription **)((long)ppvVar10 + lVar9))
        ;
        if (local_170.description_ == (ModelDescription *)0x0) {
          pMVar4 = (ModelDescription *)operator_new(0x78);
          CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
          local_170.description_ = pMVar4;
        }
        pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                           (&((local_170.description_)->traininginput_).super_RepeatedPtrFieldBase,
                            (Type *)0x0);
        CoreML::Specification::FeatureDescription::CopyFrom(pTVar6,(FeatureDescription *)local_140);
        CoreML::Specification::FeatureDescription::~FeatureDescription
                  ((FeatureDescription *)local_140);
        lVar9 = lVar9 + 8;
      } while (lVar7 * 8 != lVar9);
    }
    CoreML::Model::validate((Result *)local_140,&local_170);
    local_110 = (pointer)local_140;
    std::__cxx11::string::operator=((string *)&local_108,(string *)&local_138);
    if (local_138._M_p != local_130 + 8) {
      operator_delete(local_138._M_p,local_130._8_8_ + 1);
    }
    bVar2 = CoreML::Result::good((Result *)&local_110);
    iVar8 = 0;
    if (!bVar2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                 ,0x7c);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x57d);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(res).good()",0xc);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      iVar8 = 1;
      std::ostream::flush();
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_p != &local_f8) {
    operator_delete(local_108._M_p,local_f8._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&local_170);
  return iVar8;
}

Assistant:

int testInvalid_NoTrainingInputs() {
    Specification::Model spec;
    Result res;
    TensorAttributes tensorAttributesIn = { "InTensor", 3 };
    TensorAttributes tensorAttributesOut = { "OutTensor", 1 };

    (void)buildBasicNeuralNetworkModel(spec, true, &tensorAttributesIn, &tensorAttributesOut, 1024);
    spec.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);
    auto neuralNet = spec.mutable_neuralnetwork();

    // set a softmax layer
    (void)addSoftmaxLayer(spec, "softmax", "OutTensor", "softmax_out");

    addCategoricalCrossEntropyLoss(spec, neuralNet, "cross_entropy_loss_layer", "softmax_out", "target");


    addLearningRate(neuralNet, Specification::Optimizer::kSgdOptimizer, 0.7f, 0.0f, 1.0f);
    addMiniBatchSize(neuralNet, Specification::Optimizer::kSgdOptimizer, 10, 5, 100, std::set<int64_t>());
    addEpochs(neuralNet, 100, 1, 100, std::set<int64_t>());
    addShuffleAndSeed(neuralNet, 2019, 0, 2019, std::set<int64_t>());

    spec.mutable_description()->clear_traininginput(); // Clearing all training inputs, buildBasicNeuralNetworkModel() adds model inputs to training inputs

    res = Model::validate(spec);
    ML_ASSERT_BAD(res);

    // Add target and model's inputs to training inputs
    auto trainingInputTarget = spec.mutable_description()->mutable_traininginput()->Add();
    trainingInputTarget->set_name("target");
    auto trainingInputTensorShape = trainingInputTarget->mutable_type()->mutable_multiarraytype();
    trainingInputTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_INT32);
    trainingInputTensorShape->add_shape(1);

    for (auto feature : spec.description().input()) {
        auto trainingInputModel = spec.mutable_description()->mutable_traininginput()->Add();
        trainingInputModel->CopyFrom(feature);
    }
    res = Model::validate(spec);
    ML_ASSERT_GOOD(res);
    return 0;
}